

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall OpenMD::Electrostatic::calcForce(Electrostatic *this,InteractionData *idat)

{
  reference pvVar1;
  reference this_00;
  double *pdVar2;
  int *in_RSI;
  long in_RDI;
  double dVar3;
  RealType RVar4;
  Vector3<double> *v1;
  ElectrostaticAtomData *in_stack_ffffffffffffe8f8;
  ElectrostaticAtomData *in_stack_ffffffffffffe900;
  Vector<double,_3U> *in_stack_ffffffffffffe908;
  Vector<double,_3U> *in_stack_ffffffffffffe910;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffe920;
  double dVar5;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffe928;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffe930;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffe938;
  RealType *in_stack_ffffffffffffe958;
  CubicSpline *in_stack_ffffffffffffe960;
  Vector3<double> *v2;
  Vector3<double> *in_stack_ffffffffffffe968;
  RealType *in_stack_ffffffffffffe978;
  RealType *in_stack_ffffffffffffe980;
  RealType *in_stack_ffffffffffffe988;
  CubicSpline *in_stack_ffffffffffffe990;
  Electrostatic *in_stack_fffffffffffff250;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize(in_stack_fffffffffffff250);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)*in_RSI);
  if (*pvVar1 == -1) {
    *(undefined1 *)(in_RDI + 0x8e8) = 0;
    *(undefined1 *)(in_RDI + 0x8e9) = 0;
    *(undefined1 *)(in_RDI + 0x8ea) = 0;
    *(undefined1 *)(in_RDI + 0x8eb) = 0;
    *(undefined1 *)(in_RDI + 0x8ec) = 0;
  }
  else {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)*in_RSI);
    std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
    operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                *)(in_RDI + 200),(long)*pvVar1);
    ElectrostaticAtomData::operator=(in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
    *(byte *)(in_RDI + 0x8e8) = *(byte *)(in_RDI + 0x380) & 1;
    *(byte *)(in_RDI + 0x8e9) = *(byte *)(in_RDI + 0x381) & 1;
    *(byte *)(in_RDI + 0x8ea) = *(byte *)(in_RDI + 0x382) & 1;
    *(byte *)(in_RDI + 0x8eb) = *(byte *)(in_RDI + 899) & 1;
    *(byte *)(in_RDI + 0x8ec) = *(byte *)(in_RDI + 900) & 1;
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)in_RSI[1]);
  if (*pvVar1 == -1) {
    *(undefined1 *)(in_RDI + 0x8ed) = 0;
    *(undefined1 *)(in_RDI + 0x8ee) = 0;
    *(undefined1 *)(in_RDI + 0x8ef) = 0;
    *(undefined1 *)(in_RDI + 0x8f0) = 0;
    *(undefined1 *)(in_RDI + 0x8f1) = 0;
  }
  else {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)in_RSI[1]);
    std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
    operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                *)(in_RDI + 200),(long)*pvVar1);
    ElectrostaticAtomData::operator=(in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
    *(byte *)(in_RDI + 0x8ed) = *(byte *)(in_RDI + 0x410) & 1;
    *(byte *)(in_RDI + 0x8ee) = *(byte *)(in_RDI + 0x411) & 1;
    *(byte *)(in_RDI + 0x8ef) = *(byte *)(in_RDI + 0x412) & 1;
    *(byte *)(in_RDI + 0x8f0) = *(byte *)(in_RDI + 0x413) & 1;
    *(byte *)(in_RDI + 0x8f1) = *(byte *)(in_RDI + 0x414) & 1;
  }
  *(undefined8 *)(in_RDI + 0x7b8) = 0;
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x7c0));
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x7d8));
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x7f0));
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x808));
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x820));
  *(undefined8 *)(in_RDI + 0x838) = 0;
  *(undefined8 *)(in_RDI + 0x840) = 0;
  *(undefined8 *)(in_RDI + 0x848) = 0;
  *(undefined8 *)(in_RDI + 0x850) = 0;
  *(undefined8 *)(in_RDI + 0x858) = 0;
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x860));
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x878));
  Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x890));
  *(undefined8 *)(in_RDI + 0x8a8) = 0;
  *(double *)(in_RDI + 0x570) = 1.0 / *(double *)(in_RSI + 8);
  OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_ffffffffffffe908,
             (Vector<double,_3U> *)in_stack_ffffffffffffe900);
  if ((((*(byte *)(in_RDI + 0x8ec) & 1) != 0) || ((*(byte *)(in_RDI + 0x8f1) & 1) != 0)) &&
     ((*(byte *)(in_RSI + 0x13) & 1) != 0)) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),(long)*in_RSI);
    this_00 = std::
              vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
              ::operator[]((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                            *)(in_RDI + 0xe0),(long)*pvVar1);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),(long)in_RSI[1]);
    std::
    vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
    ::operator[](this_00,(long)*pvVar1);
    std::shared_ptr<OpenMD::CubicSpline>::operator=
              ((shared_ptr<OpenMD::CubicSpline> *)in_stack_ffffffffffffe900,
               (shared_ptr<OpenMD::CubicSpline> *)in_stack_ffffffffffffe8f8);
  }
  if (((*(byte *)(in_RDI + 0x8e8) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ed) & 1) != 0)) {
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410c0a);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
  }
  if (((*(byte *)(in_RDI + 0x8e9) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ee) & 1) != 0)) {
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410c6d);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    *(double *)(in_RDI + 0x208) = *(double *)(in_RDI + 0x570) * *(double *)(in_RDI + 0x180);
  }
  if ((((*(byte *)(in_RDI + 0x8ea) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ef) & 1) != 0)) ||
     (((*(byte *)(in_RDI + 0x8e9) & 1) != 0 && ((*(byte *)(in_RDI + 0x8ee) & 1) != 0)))) {
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410d1a);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410d5b);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    *(double *)(in_RDI + 0x210) = *(double *)(in_RDI + 0x570) * *(double *)(in_RDI + 400);
  }
  if ((((*(byte *)(in_RDI + 0x8e9) & 1) != 0) && ((*(byte *)(in_RDI + 0x8ef) & 1) != 0)) ||
     (((*(byte *)(in_RDI + 0x8ee) & 1) != 0 && ((*(byte *)(in_RDI + 0x8ea) & 1) != 0)))) {
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410e08);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410e49);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    *(double *)(in_RDI + 0x218) = *(double *)(in_RDI + 0x198) * *(double *)(in_RDI + 0x570);
    *(double *)(in_RDI + 0x220) = *(double *)(in_RDI + 0x1a0) * *(double *)(in_RDI + 0x570);
  }
  if (((*(byte *)(in_RDI + 0x8ea) & 1) != 0) && ((*(byte *)(in_RDI + 0x8ef) & 1) != 0)) {
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410eec);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410f2d);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x410f6e);
    CubicSpline::getValueAndDerivativeAt
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               in_stack_ffffffffffffe978);
    *(double *)(in_RDI + 0x228) = *(double *)(in_RDI + 0x1b0) * *(double *)(in_RDI + 0x570);
    *(double *)(in_RDI + 0x230) = *(double *)(in_RDI + 0x1b8) * *(double *)(in_RDI + 0x570);
  }
  if ((*(byte *)(in_RDI + 0x8e8) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0x4a0) = *(undefined8 *)(in_RDI + 0x388);
    if ((*(byte *)(in_RDI + 0x8eb) & 1) != 0) {
      *(double *)(in_RDI + 0x4a0) = *(double *)(in_RSI + 0xbc) + *(double *)(in_RDI + 0x4a0);
    }
    if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x840) =
           *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x148) * *(double *)(in_RDI + 0x178) +
           *(double *)(in_RDI + 0x840);
    }
    else {
      *(double *)(in_RSI + 0xd2) = *(double *)(in_RDI + 0x4a0) + *(double *)(in_RSI + 0xd2);
    }
  }
  if ((*(byte *)(in_RDI + 0x8e9) & 1) != 0) {
    dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
    *(double *)(in_RDI + 0x578) = dVar3;
    cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe900,
               (Vector3<double> *)in_stack_ffffffffffffe8f8);
    if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x840) =
           *(double *)(in_RDI + 0x150) * *(double *)(in_RDI + 0x180) * *(double *)(in_RDI + 0x578) +
           *(double *)(in_RDI + 0x840);
    }
  }
  if ((*(byte *)(in_RDI + 0x8ea) & 1) != 0) {
    dVar3 = SquareMatrix3<double>::trace((SquareMatrix3<double> *)(in_RSI + 0x80));
    *(double *)(in_RDI + 0x5c8) = dVar3;
    OpenMD::operator*(in_stack_ffffffffffffe928,(Vector<double,_3U> *)in_stack_ffffffffffffe920);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe908,
               (Vector<double,_3U> *)in_stack_ffffffffffffe900);
    OpenMD::operator*((Vector<double,_3U> *)in_stack_ffffffffffffe928,in_stack_ffffffffffffe920);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe908,
               (Vector<double,_3U> *)in_stack_ffffffffffffe900);
    dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
    *(double *)(in_RDI + 0x5b8) = dVar3;
    cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe900,
               (Vector3<double> *)in_stack_ffffffffffffe8f8);
    if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x840) =
           *(double *)(in_RDI + 0x160) *
           (*(double *)(in_RDI + 0x188) * *(double *)(in_RDI + 0x5c8) +
           *(double *)(in_RDI + 400) * *(double *)(in_RDI + 0x5b8)) + *(double *)(in_RDI + 0x840);
    }
  }
  if ((*(byte *)(in_RDI + 0x8ed) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0x4a8) = *(undefined8 *)(in_RDI + 0x418);
    if ((*(byte *)(in_RDI + 0x8f0) & 1) != 0) {
      *(double *)(in_RDI + 0x4a8) = *(double *)(in_RSI + 0xbe) + *(double *)(in_RDI + 0x4a8);
    }
    if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x838) =
           *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x148) * *(double *)(in_RDI + 0x178) +
           *(double *)(in_RDI + 0x838);
    }
    else {
      *(double *)(in_RSI + 0xd0) = *(double *)(in_RDI + 0x4a8) + *(double *)(in_RSI + 0xd0);
    }
  }
  if ((*(byte *)(in_RDI + 0x8ee) & 1) != 0) {
    dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
    *(double *)(in_RDI + 0x580) = dVar3;
    cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe900,
               (Vector3<double> *)in_stack_ffffffffffffe8f8);
    if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x838) =
           *(double *)(in_RDI + 0x150) * *(double *)(in_RDI + 0x180) * *(double *)(in_RDI + 0x580) +
           *(double *)(in_RDI + 0x838);
    }
  }
  if ((*(byte *)(in_RDI + 0x8ef) & 1) != 0) {
    dVar3 = SquareMatrix3<double>::trace((SquareMatrix3<double> *)(in_RSI + 0x92));
    *(double *)(in_RDI + 0x5d0) = dVar3;
    OpenMD::operator*(in_stack_ffffffffffffe928,(Vector<double,_3U> *)in_stack_ffffffffffffe920);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe908,
               (Vector<double,_3U> *)in_stack_ffffffffffffe900);
    OpenMD::operator*((Vector<double,_3U> *)in_stack_ffffffffffffe928,in_stack_ffffffffffffe920);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe908,
               (Vector<double,_3U> *)in_stack_ffffffffffffe900);
    dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
    *(double *)(in_RDI + 0x5c0) = dVar3;
    cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffe900,
               (Vector3<double> *)in_stack_ffffffffffffe8f8);
    if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x838) =
           *(double *)(in_RDI + 0x160) *
           (*(double *)(in_RDI + 0x188) * *(double *)(in_RDI + 0x5d0) +
           *(double *)(in_RDI + 400) * *(double *)(in_RDI + 0x5c0)) + *(double *)(in_RDI + 0x838);
    }
  }
  if ((*(byte *)(in_RDI + 0x8e8) & 1) != 0) {
    if ((*(byte *)(in_RDI + 0x8ed) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x148) * *(double *)(in_RSI + 0x16);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x668) *
           *(double *)(in_RDI + 0x178) + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      if ((*(int *)(in_RDI + 0x254) == 5) && ((*(byte *)(in_RSI + 0x13) & 1) != 0)) {
        *(double *)(in_RDI + 0x8b0) =
             *(double *)(in_RDI + 0x2d0) * *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x4a0)
             * *(double *)(in_RDI + 0x4a8) * *(double *)(in_RSI + 10);
        *(double *)(in_RDI + 0x858) = *(double *)(in_RDI + 0x8b0) + *(double *)(in_RDI + 0x858);
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      }
      if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
        if ((*(byte *)(in_RDI + 0x8eb) & 1) != 0) {
          *(double *)(in_RDI + 0x848) =
               *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x668) *
               *(double *)(in_RDI + 0x178) + *(double *)(in_RDI + 0x848);
        }
        if ((*(byte *)(in_RDI + 0x8f0) & 1) != 0) {
          *(double *)(in_RDI + 0x850) =
               *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x668) *
               *(double *)(in_RDI + 0x178) + *(double *)(in_RDI + 0x850);
        }
      }
      else if (((*(byte *)(in_RDI + 0x8ec) & 1) != 0) || ((*(byte *)(in_RDI + 0x8f1) & 1) != 0)) {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x411d2c);
        RVar4 = CubicSpline::getValueAt(in_stack_ffffffffffffe960,in_stack_ffffffffffffe958);
        *(RealType *)(in_RDI + 0x8b8) = RVar4;
        *(double *)(in_RDI + 0x8a8) =
             *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x8b8)
             + *(double *)(in_RDI + 0x8a8);
        if ((*(byte *)(in_RDI + 0x8eb) & 1) != 0) {
          *(double *)(in_RDI + 0x848) =
               *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x8b8) +
               *(double *)(in_RDI + 0x848);
        }
        if ((*(byte *)(in_RDI + 0x8f0) & 1) != 0) {
          *(double *)(in_RDI + 0x850) =
               *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x8b8) +
               *(double *)(in_RDI + 0x850);
        }
      }
    }
    if ((*(byte *)(in_RDI + 0x8ee) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x150) * *(double *)(in_RSI + 0x16);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x180) *
           *(double *)(in_RDI + 0x580) + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      if ((*(byte *)(in_RDI + 0x8eb) & 1) != 0) {
        *(double *)(in_RDI + 0x848) =
             *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x180) * *(double *)(in_RDI + 0x580)
             + *(double *)(in_RDI + 0x848);
      }
      if ((*(int *)(in_RDI + 0x254) == 5) && ((*(byte *)(in_RSI + 0x13) & 1) != 0)) {
        *(double *)(in_RDI + 0x8b0) =
             *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x2d0)
             * 2.0 * *(double *)(in_RSI + 8);
        *(double *)(in_RDI + 0x858) =
             *(double *)(in_RDI + 0x8b0) * *(double *)(in_RDI + 0x580) + *(double *)(in_RDI + 0x858)
        ;
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        operator/(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      }
    }
    if ((*(byte *)(in_RDI + 0x8ef) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x160) * *(double *)(in_RSI + 0x16);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x4a0) * *(double *)(in_RDI + 0x668) *
           (*(double *)(in_RDI + 0x188) * *(double *)(in_RDI + 0x5d0) +
           *(double *)(in_RDI + 400) * *(double *)(in_RDI + 0x5c0)) + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      if ((*(byte *)(in_RDI + 0x8eb) & 1) != 0) {
        *(double *)(in_RDI + 0x848) =
             *(double *)(in_RDI + 0x668) *
             (*(double *)(in_RDI + 0x188) * *(double *)(in_RDI + 0x5d0) +
             *(double *)(in_RDI + 400) * *(double *)(in_RDI + 0x5c0)) + *(double *)(in_RDI + 0x848);
      }
    }
  }
  if ((*(byte *)(in_RDI + 0x8e9) & 1) != 0) {
    if ((*(byte *)(in_RDI + 0x8ed) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x150) * *(double *)(in_RSI + 0x16);
      *(double *)(in_RDI + 0x7b8) =
           -(*(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x180)
            ) * *(double *)(in_RDI + 0x578) + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      if ((*(byte *)(in_RDI + 0x8f0) & 1) != 0) {
        *(double *)(in_RDI + 0x850) =
             -(*(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x180)) *
             *(double *)(in_RDI + 0x578) + *(double *)(in_RDI + 0x850);
      }
      if ((*(int *)(in_RDI + 0x254) == 5) && ((*(byte *)(in_RSI + 0x13) & 1) != 0)) {
        *(double *)(in_RDI + 0x8b0) =
             *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x2d0)
             * 2.0 * *(double *)(in_RSI + 8);
        *(double *)(in_RDI + 0x858) =
             -*(double *)(in_RDI + 0x8b0) * *(double *)(in_RDI + 0x578) +
             *(double *)(in_RDI + 0x858);
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        operator/(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator-=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator-=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      }
    }
    if ((*(byte *)(in_RDI + 0x8ee) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x158) * *(double *)(in_RSI + 0x16);
      dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
      *(double *)(in_RDI + 0x670) = dVar3;
      cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe900,
                 (Vector3<double> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x7b8) =
           -*(double *)(in_RDI + 0x668) *
           (*(double *)(in_RDI + 0x670) * *(double *)(in_RDI + 0x188) +
           *(double *)(in_RDI + 0x578) * *(double *)(in_RDI + 0x580) * *(double *)(in_RDI + 400)) +
           *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      if ((*(int *)(in_RDI + 0x254) == 5) && ((*(byte *)(in_RSI + 0x13) & 1) != 0)) {
        *(double *)(in_RDI + 0x8b0) =
             -*(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x2d0) * 2.0;
        *(double *)(in_RDI + 0x858) =
             *(double *)(in_RDI + 0x8b0) * *(double *)(in_RDI + 0x670) + *(double *)(in_RDI + 0x858)
        ;
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
        OpenMD::operator*((double)in_stack_ffffffffffffe908,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe900);
        Vector<double,_3U>::operator-=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      }
    }
    if ((*(byte *)(in_RDI + 0x8ef) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x168) * *(double *)(in_RSI + 0x16);
      OpenMD::operator*((Vector<double,_3U> *)in_stack_ffffffffffffe928,in_stack_ffffffffffffe920);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe908,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
      *(double *)(in_RDI + 0x680) = dVar3;
      cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe900,
                 (Vector3<double> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x7b8) =
           -*(double *)(in_RDI + 0x668) *
           ((*(double *)(in_RDI + 0x5d0) * *(double *)(in_RDI + 0x578) +
            *(double *)(in_RDI + 0x680) * 2.0) * *(double *)(in_RDI + 0x198) +
           *(double *)(in_RDI + 0x578) * *(double *)(in_RDI + 0x5c0) * *(double *)(in_RDI + 0x1a0))
           + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
  }
  if ((*(byte *)(in_RDI + 0x8ea) & 1) != 0) {
    if ((*(byte *)(in_RDI + 0x8ed) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x160) * *(double *)(in_RSI + 0x16);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x4a8) * *(double *)(in_RDI + 0x668) *
           (*(double *)(in_RDI + 0x188) * *(double *)(in_RDI + 0x5c8) +
           *(double *)(in_RDI + 400) * *(double *)(in_RDI + 0x5b8)) + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      if ((*(byte *)(in_RDI + 0x8f0) & 1) != 0) {
        *(double *)(in_RDI + 0x850) =
             *(double *)(in_RDI + 0x668) *
             (*(double *)(in_RDI + 0x188) * *(double *)(in_RDI + 0x5c8) +
             *(double *)(in_RDI + 400) * *(double *)(in_RDI + 0x5b8)) + *(double *)(in_RDI + 0x850);
      }
    }
    if ((*(byte *)(in_RDI + 0x8ee) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x168) * *(double *)(in_RSI + 0x16);
      OpenMD::operator*((Vector<double,_3U> *)in_stack_ffffffffffffe928,in_stack_ffffffffffffe920);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe908,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
      *(double *)(in_RDI + 0x688) = dVar3;
      cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe900,
                 (Vector3<double> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x668) *
           ((*(double *)(in_RDI + 0x5c8) * *(double *)(in_RDI + 0x580) +
            *(double *)(in_RDI + 0x688) * 2.0) * *(double *)(in_RDI + 0x198) +
           *(double *)(in_RDI + 0x580) * *(double *)(in_RDI + 0x5b8) * *(double *)(in_RDI + 0x1a0))
           + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
    if ((*(byte *)(in_RDI + 0x8ef) & 1) != 0) {
      *(double *)(in_RDI + 0x668) = *(double *)(in_RDI + 0x170) * *(double *)(in_RSI + 0x16);
      OpenMD::operator*((SquareMatrix3<double> *)in_stack_ffffffffffffe938,
                        (SquareMatrix3<double> *)in_stack_ffffffffffffe930);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_ffffffffffffe900,
                 (SquareMatrix3<double> *)in_stack_ffffffffffffe8f8);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x413ef2);
      dVar3 = SquareMatrix3<double>::trace((SquareMatrix3<double> *)(in_RDI + 0x770));
      *(double *)(in_RDI + 0x678) = dVar3;
      OpenMD::operator*((Vector<double,_3U> *)in_stack_ffffffffffffe928,in_stack_ffffffffffffe920);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe908,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe928,(Vector<double,_3U> *)in_stack_ffffffffffffe920);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe908,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      mCross<double,3u,3u>(in_stack_ffffffffffffe938,in_stack_ffffffffffffe930);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe908,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      dVar3 = dot<double,3u>(in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
      *(double *)(in_RDI + 0x690) = dVar3;
      cross<double>(in_stack_ffffffffffffe968,(Vector3<double> *)in_stack_ffffffffffffe960);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe900,
                 (Vector3<double> *)in_stack_ffffffffffffe8f8);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x668) *
           (*(double *)(in_RDI + 0x5c8) * *(double *)(in_RDI + 0x5d0) +
           *(double *)(in_RDI + 0x678) * 2.0) * *(double *)(in_RDI + 0x1a8) +
           *(double *)(in_RDI + 0x7b8);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x668) *
           (*(double *)(in_RDI + 0x690) * 4.0 +
           *(double *)(in_RDI + 0x5c8) * *(double *)(in_RDI + 0x5c0) +
           *(double *)(in_RDI + 0x5d0) * *(double *)(in_RDI + 0x5b8)) * *(double *)(in_RDI + 0x1b0)
           + *(double *)(in_RDI + 0x7b8);
      *(double *)(in_RDI + 0x7b8) =
           *(double *)(in_RDI + 0x668) * *(double *)(in_RDI + 0x5b8) * *(double *)(in_RDI + 0x5c0) *
           *(double *)(in_RDI + 0x1b8) + *(double *)(in_RDI + 0x7b8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      v2 = *(Vector3<double> **)(in_RDI + 0x668);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      v1 = (Vector3<double> *)(*(double *)(in_RDI + 0x5d0) * -2.0);
      cross<double>(v1,v2);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      cross<double>(v1,v2);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      cross<double>(v1,v2);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      cross<double>(v1,v2);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      cross<double>(v1,v2);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator-(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator+(in_stack_ffffffffffffe908,(Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
      cross<double>(v1,v2);
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
  }
  if ((*(byte *)((long)in_RSI + 0xd9) & 1) != 0) {
    OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
               (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
               (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
  }
  if ((*(byte *)((long)in_RSI + 0xda) & 1) != 0) {
    *(double *)(in_RSI + 0xd4) =
         *(double *)(in_RDI + 0x838) * *(double *)(in_RSI + 0x16) + *(double *)(in_RSI + 0xd4);
    *(double *)(in_RSI + 0xd6) =
         *(double *)(in_RDI + 0x840) * *(double *)(in_RSI + 0x16) + *(double *)(in_RSI + 0xd6);
  }
  if ((*(byte *)(in_RDI + 0x8eb) & 1) != 0) {
    *(double *)(in_RSI + 0xc0) =
         *(double *)(in_RDI + 0x848) * *(double *)(in_RSI + 0x10) + *(double *)(in_RSI + 0xc0);
  }
  if ((*(byte *)(in_RDI + 0x8f0) & 1) != 0) {
    *(double *)(in_RSI + 0xc2) =
         *(double *)(in_RDI + 0x850) * *(double *)(in_RSI + 0x10) + *(double *)(in_RSI + 0xc2);
  }
  if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
    *(double *)(in_RSI + 0x34) = *(double *)(in_RDI + 0x7b8) + *(double *)(in_RSI + 0x34);
    dVar3 = *(double *)(in_RDI + 0x7b8);
    dVar5 = *(double *)(in_RSI + 0x10);
    pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),2);
    *pdVar2 = dVar3 * dVar5 + *pdVar2;
    if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
      dVar3 = *(double *)(in_RDI + 0x7b8);
      dVar5 = *(double *)(in_RSI + 0x10);
      pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),2);
      *pdVar2 = dVar3 * dVar5 + *pdVar2;
    }
    OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
               (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    if (((*(byte *)(in_RDI + 0x8e9) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ea) & 1) != 0)) {
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
    if (((*(byte *)(in_RDI + 0x8ee) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ef) & 1) != 0)) {
      OpenMD::operator*(in_stack_ffffffffffffe908,(double)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
  }
  else {
    *(double *)(in_RSI + 0x34) = *(double *)(in_RDI + 0x858) + *(double *)(in_RSI + 0x34);
    dVar3 = *(double *)(in_RDI + 0x8a8);
    pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x26),2);
    *pdVar2 = dVar3 + *pdVar2;
    dVar3 = *(double *)(in_RSI + 0x10);
    dVar5 = *(double *)(in_RDI + 0x858);
    pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),2);
    *pdVar2 = dVar3 * dVar5 + *pdVar2;
    if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
      in_stack_ffffffffffffe900 = *(ElectrostaticAtomData **)(in_RSI + 0x10);
      in_stack_ffffffffffffe908 = *(Vector<double,_3U> **)(in_RDI + 0x858);
      pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),2);
      *pdVar2 = (double)in_stack_ffffffffffffe900 * (double)in_stack_ffffffffffffe908 + *pdVar2;
    }
    OpenMD::operator*((double)in_stack_ffffffffffffe908,
                      (Vector<double,_3U> *)in_stack_ffffffffffffe900);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
               (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    if (((*(byte *)(in_RDI + 0x8e9) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ea) & 1) != 0)) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
    if (((*(byte *)(in_RDI + 0x8ee) & 1) != 0) || ((*(byte *)(in_RDI + 0x8ef) & 1) != 0)) {
      OpenMD::operator*((double)in_stack_ffffffffffffe908,
                        (Vector<double,_3U> *)in_stack_ffffffffffffe900);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffe900,
                 (Vector<double,_3U> *)in_stack_ffffffffffffe8f8);
    }
  }
  return;
}

Assistant:

void Electrostatic::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (Etids[idat.atid1] != -1) {
      data1              = ElectrostaticMap[Etids[idat.atid1]];
      a_is_Charge        = data1.is_Charge;
      a_is_Dipole        = data1.is_Dipole;
      a_is_Quadrupole    = data1.is_Quadrupole;
      a_is_Fluctuating   = data1.is_Fluctuating;
      a_uses_SlaterIntra = data1.uses_SlaterIntramolecular;

    } else {
      a_is_Charge        = false;
      a_is_Dipole        = false;
      a_is_Quadrupole    = false;
      a_is_Fluctuating   = false;
      a_uses_SlaterIntra = false;
    }
    if (Etids[idat.atid2] != -1) {
      data2              = ElectrostaticMap[Etids[idat.atid2]];
      b_is_Charge        = data2.is_Charge;
      b_is_Dipole        = data2.is_Dipole;
      b_is_Quadrupole    = data2.is_Quadrupole;
      b_is_Fluctuating   = data2.is_Fluctuating;
      b_uses_SlaterIntra = data2.uses_SlaterIntramolecular;

    } else {
      b_is_Charge        = false;
      b_is_Dipole        = false;
      b_is_Quadrupole    = false;
      b_is_Fluctuating   = false;
      b_uses_SlaterIntra = false;
    }

    U = 0.0;      // Potential
    F.zero();     // Force
    Ta.zero();    // Torque on site a
    Tb.zero();    // Torque on site b
    Ea.zero();    // Electric field at site a
    Eb.zero();    // Electric field at site b
    Pa    = 0.0;  // Site potential at site a
    Pb    = 0.0;  // Site potential at site b
    dUdCa = 0.0;  // fluctuating charge force at site a
    dUdCb = 0.0;  // fluctuating charge force at site a

    // Indirect interactions mediated by the reaction field.
    indirect_Pot = 0.0;  // Potential
    indirect_F.zero();   // Force
    indirect_Ta.zero();  // Torque on site a
    indirect_Tb.zero();  // Torque on site b

    // Excluded potential that is still computed for fluctuating charges
    excluded_Pot = 0.0;

    // some variables we'll need independent of electrostatic type:

    ri   = 1.0 / idat.rij;
    rhat = idat.d * ri;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (((a_uses_SlaterIntra || b_uses_SlaterIntra) && idat.excluded)) {
      J = Jij[FQtids[idat.atid1]][FQtids[idat.atid2]];
    }

    // needed for fields (and forces):
    if (a_is_Charge || b_is_Charge) {
      v01s->getValueAndDerivativeAt(idat.rij, v01, dv01);
    }
    if (a_is_Dipole || b_is_Dipole) {
      v11s->getValueAndDerivativeAt(idat.rij, v11, dv11);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole || (a_is_Dipole && b_is_Dipole)) {
      v21s->getValueAndDerivativeAt(idat.rij, v21, dv21);
      v22s->getValueAndDerivativeAt(idat.rij, v22, dv22);
      v22or = ri * v22;
    }

    // needed for potentials (and forces and torques):
    if ((a_is_Dipole && b_is_Quadrupole) || (b_is_Dipole && a_is_Quadrupole)) {
      v31s->getValueAndDerivativeAt(idat.rij, v31, dv31);
      v32s->getValueAndDerivativeAt(idat.rij, v32, dv32);
      v31or = v31 * ri;
      v32or = v32 * ri;
    }
    if (a_is_Quadrupole && b_is_Quadrupole) {
      v41s->getValueAndDerivativeAt(idat.rij, v41, dv41);
      v42s->getValueAndDerivativeAt(idat.rij, v42, dv42);
      v43s->getValueAndDerivativeAt(idat.rij, v43, dv43);
      v42or = v42 * ri;
      v43or = v43 * ri;
    }

    // calculate the single-site contributions (fields, etc).

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += idat.flucQ1; }

      if (idat.excluded) {
        idat.skippedCharge2 += C_a;
      } else {
        // only do the field and site potentials if we're not excluded:
        Eb -= C_a * pre11_ * dv01 * rhat;
        Pb += C_a * pre11_ * v01;
      }
    }

    if (a_is_Dipole) {
      rdDa = dot(rhat, idat.D_1);
      rxDa = cross(rhat, idat.D_1);
      if (!idat.excluded) {
        Eb -= pre12_ * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Pb += pre12_ * v11 * rdDa;
      }
    }

    if (a_is_Quadrupole) {
      trQa  = idat.Q_1.trace();
      Qar   = idat.Q_1 * rhat;
      rQa   = rhat * idat.Q_1;
      rdQar = dot(rhat, Qar);
      rxQar = cross(rhat, Qar);
      if (!idat.excluded) {
        Eb -= pre14_ * (trQa * rhat * dv21 + 2.0 * Qar * v22or +
                        rdQar * rhat * (dv22 - 2.0 * v22or));
        Pb += pre14_ * (v21 * trQa + v22 * rdQar);
      }
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) { C_b += idat.flucQ2; }

      if (idat.excluded) {
        idat.skippedCharge1 += C_b;
      } else {
        // only do the field if we're not excluded:
        Ea += C_b * pre11_ * dv01 * rhat;
        Pa += C_b * pre11_ * v01;
      }
    }

    if (b_is_Dipole) {
      rdDb = dot(rhat, idat.D_2);
      rxDb = cross(rhat, idat.D_2);
      if (!idat.excluded) {
        Ea += pre12_ * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Pa += pre12_ * v11 * rdDb;
      }
    }

    if (b_is_Quadrupole) {
      trQb  = idat.Q_2.trace();
      Qbr   = idat.Q_2 * rhat;
      rQb   = rhat * idat.Q_2;
      rdQbr = dot(rhat, Qbr);
      rxQbr = cross(rhat, Qbr);
      if (!idat.excluded) {
        Ea += pre14_ * (trQb * rhat * dv21 + 2.0 * Qbr * v22or +
                        rdQbr * rhat * (dv22 - 2.0 * v22or));
        Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Charge) {
      if (b_is_Charge) {
        pref = pre11_ * idat.electroMult;
        U += C_a * C_b * pref * v01;
        F += C_a * C_b * pref * dv01 * rhat;

        // If this is an excluded pair, there are still indirect
        // interactions via the reaction field we must worry about:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = preRF_ * pref * C_a * C_b * idat.r2;
          indirect_Pot += rfContrib;
          indirect_F += rfContrib * 2.0 * ri * rhat;
        }

        // Fluctuating charge forces are handled via Coulomb integrals
        // for excluded pairs (i.e. those connected via bonds) and
        // with the standard charge-charge interaction otherwise.

        if (idat.excluded) {
          if (a_uses_SlaterIntra || b_uses_SlaterIntra) {
            coulInt = J->getValueAt(idat.rij);
            excluded_Pot += C_a * C_b * coulInt;
            if (a_is_Fluctuating) dUdCa += C_b * coulInt;
            if (b_is_Fluctuating) dUdCb += C_a * coulInt;
          }
        } else {
          if (a_is_Fluctuating) dUdCa += C_b * pref * v01;
          if (b_is_Fluctuating) dUdCb += C_a * pref * v01;
        }
      }

      if (b_is_Dipole) {
        pref = pre12_ * idat.electroMult;
        U += C_a * pref * v11 * rdDb;
        F += C_a * pref * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Tb += C_a * pref * v11 * rxDb;

        if (a_is_Fluctuating) dUdCa += pref * v11 * rdDb;

        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated charge-dipole
        // interaction:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_a * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot += rfContrib * rdDb;
          indirect_F += rfContrib * idat.D_2 / idat.rij;
          indirect_Tb += C_a * pref * preRF_ * rxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref = pre14_ * idat.electroMult;
        U += C_a * pref * (v21 * trQb + v22 * rdQbr);
        F += C_a * pref * (trQb * dv21 * rhat + 2.0 * Qbr * v22or);
        F += C_a * pref * rdQbr * rhat * (dv22 - 2.0 * v22or);
        Tb += C_a * pref * 2.0 * rxQbr * v22;

        if (a_is_Fluctuating) dUdCa += pref * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Dipole) {
      if (b_is_Charge) {
        pref = pre12_ * idat.electroMult;

        U -= C_b * pref * v11 * rdDa;
        F -= C_b * pref * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Ta -= C_b * pref * v11 * rxDa;

        if (b_is_Fluctuating) dUdCb -= pref * v11 * rdDa;

        // Even if we excluded this pair from direct interactions,
        // we still have the reaction-field-mediated charge-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_b * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot -= rfContrib * rdDa;
          indirect_F -= rfContrib * idat.D_1 / idat.rij;
          indirect_Ta -= C_b * pref * preRF_ * rxDa;
        }
      }

      if (b_is_Dipole) {
        pref  = pre22_ * idat.electroMult;
        DadDb = dot(idat.D_1, idat.D_2);
        DaxDb = cross(idat.D_1, idat.D_2);

        U -= pref * (DadDb * v21 + rdDa * rdDb * v22);
        F -= pref * (dv21 * DadDb * rhat +
                     v22or * (rdDb * idat.D_1 + rdDa * idat.D_2));
        F -= pref * (rdDa * rdDb) * (dv22 - 2.0 * v22or) * rhat;
        Ta += pref * (v21 * DaxDb - v22 * rdDb * rxDa);
        Tb += pref * (-v21 * DaxDb - v22 * rdDa * rxDb);
        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated dipole-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = -pref * preRF_ * 2.0;
          indirect_Pot += rfContrib * DadDb;
          indirect_Ta += rfContrib * DaxDb;
          indirect_Tb -= rfContrib * DaxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref   = pre24_ * idat.electroMult;
        DadQb  = idat.D_1 * idat.Q_2;
        DadQbr = dot(idat.D_1, Qbr);
        DaxQbr = cross(idat.D_1, Qbr);

        U -= pref * ((trQb * rdDa + 2.0 * DadQbr) * v31 + rdDa * rdQbr * v32);
        F -= pref * (trQb * idat.D_1 + 2.0 * DadQb) * v31or;
        F -= pref * (trQb * rdDa + 2.0 * DadQbr) * (dv31 - v31or) * rhat;
        F -= pref * (idat.D_1 * rdQbr + 2.0 * rdDa * rQb) * v32or;
        F -= pref * (rdDa * rdQbr * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-trQb * rxDa + 2.0 * DaxQbr) * v31 - rxDa * rdQbr * v32);
        Tb += pref * ((2.0 * cross(DadQb, rhat) - 2.0 * DaxQbr) * v31 -
                      2.0 * rdDa * rxQbr * v32);
      }
    }

    if (a_is_Quadrupole) {
      if (b_is_Charge) {
        pref = pre14_ * idat.electroMult;
        U += C_b * pref * (v21 * trQa + v22 * rdQar);
        F += C_b * pref * (trQa * rhat * dv21 + 2.0 * Qar * v22or);
        F += C_b * pref * rdQar * rhat * (dv22 - 2.0 * v22or);
        Ta += C_b * pref * 2.0 * rxQar * v22;

        if (b_is_Fluctuating) dUdCb += pref * (v21 * trQa + v22 * rdQar);
      }
      if (b_is_Dipole) {
        pref   = pre24_ * idat.electroMult;
        DbdQa  = idat.D_2 * idat.Q_1;
        DbdQar = dot(idat.D_2, Qar);
        DbxQar = cross(idat.D_2, Qar);

        U += pref * ((trQa * rdDb + 2.0 * DbdQar) * v31 + rdDb * rdQar * v32);
        F += pref * (trQa * idat.D_2 + 2.0 * DbdQa) * v31or;
        F += pref * (trQa * rdDb + 2.0 * DbdQar) * (dv31 - v31or) * rhat;
        F += pref * (idat.D_2 * rdQar + 2.0 * rdDb * rQa) * v32or;
        F += pref * (rdDb * rdQar * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-2.0 * cross(DbdQa, rhat) + 2.0 * DbxQar) * v31 +
                      2.0 * rdDb * rxQar * v32);
        Tb += pref * ((trQa * rxDb - 2.0 * DbxQar) * v31 + rxDb * rdQar * v32);
      }
      if (b_is_Quadrupole) {
        pref    = pre44_ * idat.electroMult;  // yes
        QaQb    = idat.Q_1 * idat.Q_2;
        trQaQb  = QaQb.trace();
        rQaQb   = rhat * QaQb;
        QaQbr   = QaQb * rhat;
        QaxQb   = mCross(idat.Q_1, idat.Q_2);
        rQaQbr  = dot(rQa, Qbr);
        rQaxQbr = cross(rQa, Qbr);

        U += pref * (trQa * trQb + 2.0 * trQaQb) * v41;
        U += pref * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) * v42;
        U += pref * (rdQar * rdQbr) * v43;

        F += pref * rhat * (trQa * trQb + 2.0 * trQaQb) * dv41;
        F += pref * rhat * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) *
             (dv42 - 2.0 * v42or);
        F += pref * rhat * (rdQar * rdQbr) * (dv43 - 4.0 * v43or);

        F += pref * 2.0 * (trQb * rQa + trQa * rQb) * v42or;
        F += pref * 4.0 * (rQaQb + QaQbr) * v42or;
        F += pref * 2.0 * (rQa * rdQbr + rdQar * rQb) * v43or;

        Ta += pref * (-4.0 * QaxQb * v41);
        Ta += pref *
              (-2.0 * trQb * cross(rQa, rhat) + 4.0 * cross(rhat, QaQbr) -
               4.0 * rQaxQbr) *
              v42;
        Ta += pref * 2.0 * cross(rhat, Qar) * rdQbr * v43;

        Tb += pref * (+4.0 * QaxQb * v41);
        Tb += pref *
              (-2.0 * trQa * cross(rQb, rhat) - 4.0 * cross(rQaQb, rhat) +
               4.0 * rQaxQbr) *
              v42;
        // Possible replacement for line 2 above:
        //             + 4.0 * cross(rhat, QbQar)

        Tb += pref * 2.0 * cross(rhat, Qbr) * rdQar * v43;
      }
    }

    if (idat.doElectricField) {
      idat.eField1 += Ea * idat.electroMult;
      idat.eField2 += Eb * idat.electroMult;
    }

    if (idat.doSitePotential) {
      idat.sPot1 += Pa * idat.electroMult;
      idat.sPot2 += Pb * idat.electroMult;
    }

    if (a_is_Fluctuating) idat.dVdFQ1 += dUdCa * idat.sw;
    if (b_is_Fluctuating) idat.dVdFQ2 += dUdCb * idat.sw;

    if (!idat.excluded) {
      idat.vpair += U;
      idat.pot[ELECTROSTATIC_FAMILY] += U * idat.sw;
      if (idat.isSelected) idat.selePot[ELECTROSTATIC_FAMILY] += U * idat.sw;

      idat.f1 += F * idat.sw;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += Ta * idat.sw;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += Tb * idat.sw;

    } else {
      // only accumulate the forces and torques resulting from the
      // indirect reaction field terms.

      idat.vpair += indirect_Pot;
      idat.excludedPot[ELECTROSTATIC_FAMILY] += excluded_Pot;
      idat.pot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;
      if (idat.isSelected)
        idat.selePot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;

      idat.f1 += idat.sw * indirect_F;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += idat.sw * indirect_Ta;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += idat.sw * indirect_Tb;
    }
    return;
  }